

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PaytableSuperFire.cpp
# Opt level: O0

void __thiscall
PaytableSuperFire::PaytableSuperFire
          (PaytableSuperFire *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *myVectorInPaytableSuperFire,double creditInPaytable,uint betInPaytable)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  int local_2c;
  int local_28;
  int j;
  int i;
  uint betInPaytable_local;
  double creditInPaytable_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *myVectorInPaytableSuperFire_local;
  PaytableSuperFire *this_local;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->_myVectorInPaytableSuperFire);
  this->_creditInPaytable = creditInPaytable;
  this->_betInPaytable = betInPaytable;
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(myVectorInPaytableSuperFire);
    if (sVar2 <= (ulong)(long)local_28) break;
    local_2c = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](myVectorInPaytableSuperFire,(long)local_28);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (sVar2 <= (ulong)(long)local_2c) break;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](myVectorInPaytableSuperFire,(long)local_28);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)local_2c);
      vVar1 = *pvVar4;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->_myVectorInPaytableSuperFire,(long)local_28);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)local_2c);
      *pvVar4 = vVar1;
      local_2c = local_2c + 1;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

PaytableSuperFire::PaytableSuperFire(std::vector<std::vector<int>>myVectorInPaytableSuperFire, double creditInPaytable, unsigned int betInPaytable) {
	_creditInPaytable = creditInPaytable;
	_betInPaytable = betInPaytable;
	for (int i = 0; i < myVectorInPaytableSuperFire.size(); ++i) {
		for (int j = 0; j < myVectorInPaytableSuperFire[i].size(); ++j) {
			_myVectorInPaytableSuperFire[i][j] = myVectorInPaytableSuperFire[i][j];
		}
	}
}